

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMap.c
# Opt level: O0

If_Man_t * Nwk_ManToIf(Aig_Man_t *p,If_Par_t *pPars,Vec_Ptr_t *vAigToIf)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  If_Man_t *p_00;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pAVar4;
  If_Obj_t *pFan0;
  If_Obj_t *pIVar5;
  void *pvVar6;
  abctime clk;
  Aig_Obj_t *pAStack_68;
  int i;
  Aig_Obj_t *pPrev;
  Aig_Obj_t *pFanin;
  Aig_Obj_t *pNode;
  If_Obj_t *pIfObj;
  If_Man_t *pIfMan;
  float *pSwitching2;
  float *pSwitching;
  Vec_Int_t *vSwitching2;
  Vec_Int_t *vSwitching;
  Vec_Ptr_t *vAigToIf_local;
  If_Par_t *pPars_local;
  Aig_Man_t *p_local;
  
  vSwitching2 = (Vec_Int_t *)0x0;
  pSwitching = (float *)0x0;
  pSwitching2 = (float *)0x0;
  pIfMan = (If_Man_t *)0x0;
  aVar2 = Abc_Clock();
  Aig_ManSetRegNum(p,0);
  if (pPars->fPower != 0) {
    vSwitching2 = Saig_ManComputeSwitchProbs(p,0x30,0x10,0);
    if (pPars->fVerbose != 0) {
      Abc_Print(1,"%s =","Computing switching activity");
      aVar3 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar3 - aVar2) * 1.0) / 1000000.0);
    }
    pSwitching2 = (float *)vSwitching2->pArray;
    iVar1 = Aig_ManObjNumMax(p);
    pSwitching = (float *)Vec_IntStart(iVar1);
    pIfMan = (If_Man_t *)((Vec_Int_t *)pSwitching)->pArray;
  }
  p_00 = If_ManStart(pPars);
  p_00->vSwitching = (Vec_Int_t *)pSwitching;
  clk._4_4_ = 0;
  do {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= clk._4_4_) {
      if (vSwitching2 != (Vec_Int_t *)0x0) {
        Vec_IntFree(vSwitching2);
      }
      return p_00;
    }
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,clk._4_4_);
    if (pObj != (Aig_Obj_t *)0x0) {
      iVar1 = Aig_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsCi(pObj);
        if (iVar1 == 0) {
          iVar1 = Aig_ObjIsCo(pObj);
          if (iVar1 == 0) {
            iVar1 = Aig_ObjIsConst1(pObj);
            if (iVar1 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMap.c"
                            ,0x9b,"If_Man_t *Nwk_ManToIf(Aig_Man_t *, If_Par_t *, Vec_Ptr_t *)");
            }
            pNode = (Aig_Obj_t *)If_ManConst1(p_00);
          }
          else {
            pAVar4 = Aig_ObjFanin0(pObj);
            pIVar5 = (If_Obj_t *)(pAVar4->field_5).pData;
            iVar1 = Aig_ObjFaninC0(pObj);
            pIVar5 = If_NotCond(pIVar5,iVar1);
            pNode = (Aig_Obj_t *)If_ManCreateCo(p_00,pIVar5);
          }
        }
        else {
          pNode = (Aig_Obj_t *)If_ManCreateCi(p_00);
          iVar1 = Aig_ObjLevel(pObj);
          If_ObjSetLevel((If_Obj_t *)pNode,iVar1);
          if (p_00->nLevelMax < (int)(*(uint *)pNode >> 0xd)) {
            p_00->nLevelMax = *(uint *)pNode >> 0xd;
          }
        }
      }
      else {
        pAVar4 = Aig_ObjFanin0(pObj);
        pIVar5 = (If_Obj_t *)(pAVar4->field_5).pData;
        iVar1 = Aig_ObjFaninC0(pObj);
        pFan0 = If_NotCond(pIVar5,iVar1);
        pAVar4 = Aig_ObjFanin1(pObj);
        pIVar5 = (If_Obj_t *)(pAVar4->field_5).pData;
        iVar1 = Aig_ObjFaninC1(pObj);
        pIVar5 = If_NotCond(pIVar5,iVar1);
        pNode = (Aig_Obj_t *)If_ManCreateAnd(p_00,pFan0,pIVar5);
      }
      pvVar6 = Vec_PtrEntry(vAigToIf,clk._4_4_);
      if (pvVar6 != (void *)0x0) {
        __assert_fail("Vec_PtrEntry(vAigToIf, i) == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMap.c"
                      ,0x9d,"If_Man_t *Nwk_ManToIf(Aig_Man_t *, If_Par_t *, Vec_Ptr_t *)");
      }
      Vec_PtrWriteEntry(vAigToIf,clk._4_4_,pNode);
      (pObj->field_5).pData = pNode;
      if (pSwitching != (float *)0x0) {
        pIfMan->nObjs[(long)*(int *)((long)&pNode->field_0 + 4) + -0x10] =
             (int)pSwitching2[pObj->Id];
      }
      iVar1 = Aig_ObjIsChoice(p,pObj);
      if (iVar1 != 0) {
        pPrev = Aig_ObjEquiv(p,pObj);
        pAStack_68 = pObj;
        for (; pPrev != (Aig_Obj_t *)0x0; pPrev = Aig_ObjEquiv(p,pPrev)) {
          If_ObjSetChoice((If_Obj_t *)(pAStack_68->field_5).pData,(If_Obj_t *)(pPrev->field_5).pData
                         );
          pAStack_68 = pPrev;
        }
        If_ManCreateChoice(p_00,(If_Obj_t *)(pObj->field_5).pData);
      }
    }
    clk._4_4_ = clk._4_4_ + 1;
  } while( true );
}

Assistant:

If_Man_t * Nwk_ManToIf( Aig_Man_t * p, If_Par_t * pPars, Vec_Ptr_t * vAigToIf )
{
    extern Vec_Int_t * Saig_ManComputeSwitchProbs( Aig_Man_t * p, int nFrames, int nPref, int fProbOne );
    Vec_Int_t * vSwitching = NULL, * vSwitching2 = NULL;
    float * pSwitching = NULL, * pSwitching2 = NULL;
    If_Man_t * pIfMan;
    If_Obj_t * pIfObj;
    Aig_Obj_t * pNode, * pFanin, * pPrev;
    int i;
    abctime clk = Abc_Clock();
    // set the number of registers (switch activity will be combinational)
    Aig_ManSetRegNum( p, 0 );
    if ( pPars->fPower )
    {
        vSwitching  = Saig_ManComputeSwitchProbs( p, 48, 16, 0 );
        if ( pPars->fVerbose )
        {
            ABC_PRT( "Computing switching activity", Abc_Clock() - clk );
        }
        pSwitching  = (float *)vSwitching->pArray;
        vSwitching2 = Vec_IntStart( Aig_ManObjNumMax(p) );
        pSwitching2 = (float *)vSwitching2->pArray;
    }
    // start the mapping manager and set its parameters
    pIfMan = If_ManStart( pPars );
    pIfMan->vSwitching = vSwitching2;
    // load the AIG into the mapper
    Aig_ManForEachObj( p, pNode, i )
    {
        if ( Aig_ObjIsAnd(pNode) )
        {
            pIfObj = If_ManCreateAnd( pIfMan, 
                If_NotCond( (If_Obj_t *)Aig_ObjFanin0(pNode)->pData, Aig_ObjFaninC0(pNode) ), 
                If_NotCond( (If_Obj_t *)Aig_ObjFanin1(pNode)->pData, Aig_ObjFaninC1(pNode) ) );
//            printf( "no%d=%d\n ", If_ObjId(pIfObj), If_ObjLevel(pIfObj) );
        }
        else if ( Aig_ObjIsCi(pNode) )
        {
            pIfObj = If_ManCreateCi( pIfMan );
            If_ObjSetLevel( pIfObj, Aig_ObjLevel(pNode) );
//            printf( "pi%d=%d\n ", If_ObjId(pIfObj), If_ObjLevel(pIfObj) );
            if ( pIfMan->nLevelMax < (int)pIfObj->Level )
                pIfMan->nLevelMax = (int)pIfObj->Level;
        }
        else if ( Aig_ObjIsCo(pNode) )
        {
            pIfObj = If_ManCreateCo( pIfMan, If_NotCond( (If_Obj_t *)Aig_ObjFanin0(pNode)->pData, Aig_ObjFaninC0(pNode) ) );
//            printf( "po%d=%d\n ", If_ObjId(pIfObj), If_ObjLevel(pIfObj) );
        }
        else if ( Aig_ObjIsConst1(pNode) )
            pIfObj = If_ManConst1( pIfMan );
        else // add the node to the mapper
            assert( 0 );
        // save the result
        assert( Vec_PtrEntry(vAigToIf, i) == NULL );
        Vec_PtrWriteEntry( vAigToIf, i, pIfObj );
        pNode->pData = pIfObj;
        if ( vSwitching2 )
            pSwitching2[pIfObj->Id] = pSwitching[pNode->Id];            
        // set up the choice node
        if ( Aig_ObjIsChoice( p, pNode ) )
        {
            for ( pPrev = pNode, pFanin = Aig_ObjEquiv(p, pNode); pFanin; pPrev = pFanin, pFanin = Aig_ObjEquiv(p, pFanin) )
                If_ObjSetChoice( (If_Obj_t *)pPrev->pData, (If_Obj_t *)pFanin->pData );
            If_ManCreateChoice( pIfMan, (If_Obj_t *)pNode->pData );
        }
//        assert( If_ObjLevel(pIfObj) == Aig_ObjLevel(pNode) );
    }
    if ( vSwitching )
        Vec_IntFree( vSwitching );
    return pIfMan;
}